

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

bool __thiscall p2t::Sweep::IsShallow(Sweep *this,SweepContext *tcx,Node *node)

{
  double local_30;
  double height;
  Node *node_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  if (((tcx->basin).left_highest & 1U) == 0) {
    local_30 = ((tcx->basin).right_node)->point->y - node->point->y;
  }
  else {
    local_30 = ((tcx->basin).left_node)->point->y - node->point->y;
  }
  return local_30 < (tcx->basin).width;
}

Assistant:

bool Sweep::IsShallow(SweepContext& tcx, Node& node)
{
  double height;

  if (tcx.basin.left_highest) {
    height = tcx.basin.left_node->point->y - node.point->y;
  } else {
    height = tcx.basin.right_node->point->y - node.point->y;
  }

  // if shallow stop filling
  if (tcx.basin.width > height) {
    return true;
  }
  return false;
}